

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkPipelineDynamicStateCreateInfo *dynamic,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar1;
  uint32_t i;
  ulong uVar2;
  Value dynamics;
  Data local_78;
  Data local_68;
  StringRefType local_50;
  StringRefType local_40;
  
  local_68.n.i64 = (Number)0x0;
  local_68.s.str = (Ch *)0x3000000000000;
  local_40.s = "flags";
  local_40.length = 5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_68.s,&local_40,dynamic->flags,alloc);
  local_78.n = (Number)0x0;
  local_78.s.str = (Ch *)0x4000000000000;
  for (uVar2 = 0; uVar2 < dynamic->dynamicStateCount; uVar2 = uVar2 + 1) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack<VkDynamicState>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_78.s,dynamic->pDynamicStates[uVar2],alloc);
  }
  local_50.s = "dynamicState";
  local_50.length = 0xc;
  pGVar1 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_68.s,&local_50,
                       (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)&local_78.s,alloc);
  if (&local_68 != &out_value->data_) {
    (out_value->data_).n = local_68.n;
    (out_value->data_).s.str = local_68.s.str;
  }
  return SUB81(pGVar1,0);
}

Assistant:

static bool json_value(const VkPipelineDynamicStateCreateInfo &dynamic, Allocator &alloc, Value *out_value)
{
	Value dyn(kObjectType);
	dyn.AddMember("flags", dynamic.flags, alloc);
	Value dynamics(kArrayType);
	for (uint32_t i = 0; i < dynamic.dynamicStateCount; i++)
		dynamics.PushBack(dynamic.pDynamicStates[i], alloc);
	dyn.AddMember("dynamicState", dynamics, alloc);

	*out_value = dyn;
	return true;
}